

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O0

string * int2str_abi_cxx11_(U8 i)

{
  byte in_SIL;
  undefined7 in_register_00000039;
  string *this;
  allocator local_1a;
  char local_19 [8];
  char number_str [8];
  U8 i_local;
  
  this = (string *)CONCAT71(in_register_00000039,i);
  unique0x10000074 = this;
  AnalyzerHelpers::GetNumberString((ulong)in_SIL,Decimal,8,local_19,8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this,local_19,&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  return this;
}

Assistant:

std::string int2str( const U8 i )
{
    char number_str[ 8 ];
    AnalyzerHelpers::GetNumberString( i, Decimal, 8, number_str, sizeof( number_str ) );
    return number_str;
}